

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

void checksum_init(chksumwork_conflict *sumwrk,sumalg sum_alg)

{
  sumalg sum_alg_local;
  chksumwork_conflict *sumwrk_local;
  
  sumwrk->alg = sum_alg;
  if (sum_alg != CKSUM_NONE) {
    if (sum_alg == CKSUM_SHA1) {
      __archive_sha1init(&sumwrk->sha1ctx);
    }
    else if (sum_alg == CKSUM_MD5) {
      __archive_md5init(&sumwrk->md5ctx);
    }
  }
  return;
}

Assistant:

static void
_checksum_init(struct chksumwork *sumwrk, int sum_alg)
{
	sumwrk->alg = sum_alg;
	switch (sum_alg) {
	case CKSUM_NONE:
		break;
	case CKSUM_SHA1:
		archive_sha1_init(&(sumwrk->sha1ctx));
		break;
	case CKSUM_MD5:
		archive_md5_init(&(sumwrk->md5ctx));
		break;
	}
}